

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  _7z_coders_info *val;
  uint *puVar2;
  byte bVar3;
  _7z_stream_info *si;
  uint64_t uVar4;
  _7z_stream_info *si_00;
  size_t sVar5;
  uchar uVar6;
  wchar_t wVar7;
  int iVar8;
  int iVar9;
  uchar *p;
  uint64_t *puVar10;
  uint32_t *puVar11;
  archive_string_conv *paVar12;
  int *piVar13;
  char *pcVar14;
  int64_t iVar15;
  uchar *puVar16;
  undefined8 extraout_RAX;
  byte *pbVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  uchar *puVar22;
  long lVar23;
  _7z_coder *p_Var24;
  _7z_coder *p_Var25;
  char *pcVar26;
  long lVar27;
  size_t b;
  _7z_folder *p_Var28;
  size_t rbytes;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint64_t uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  _7z_folder *p_Var36;
  char *pcVar37;
  long lVar38;
  ulong uVar39;
  bool bVar40;
  uint64_t *local_b0;
  uint64_t size;
  uchar *local_88;
  _7z_folder *local_80;
  undefined4 local_74;
  int64_t offset;
  _7z_header_info header;
  
  si = (_7z_stream_info *)a->format->data;
  if (*(int *)&si[199].ci.folders == -1) {
    *(undefined4 *)&si[199].ci.folders = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders == (_7z_folder *)0x0) {
    header.emptyFileBools = (uchar *)0x0;
    header.antiBools = (uchar *)0x0;
    header.dataIndex = 0;
    header.emptyStreamBools = (uchar *)0x0;
    header.attrBools = (uchar *)0x0;
    piVar13 = (int *)__archive_read_ahead(a,0x20,&offset);
    if (piVar13 == (int *)0x0) {
LAB_00180886:
      iVar9 = -0x1e;
LAB_00180888:
      bVar40 = false;
    }
    else {
      if ((((char)*piVar13 == 'M') && (*(char *)((long)piVar13 + 1) == 'Z')) ||
         (*piVar13 == 0x464c457f)) {
        if (offset < 0x27001) {
          iVar15 = __archive_read_seek(a,0x27000,0);
          if (iVar15 < 0) goto LAB_00180886;
        }
        else {
          __archive_read_consume(a,0x27000);
        }
        lVar38 = 0;
        uVar39 = 1;
        do {
          while( true ) {
            uVar20 = uVar39;
            if (0x39000 < uVar20 + lVar38) goto LAB_00180869;
            pcVar26 = (char *)__archive_read_ahead(a,uVar20,(ssize_t *)&size);
            if (pcVar26 == (char *)0x0) break;
            uVar39 = 0x1000;
            if (5 < (long)size) {
              pcVar37 = pcVar26 + size;
              for (pcVar14 = pcVar26; pcVar14 + 0x20 < pcVar37; pcVar14 = pcVar14 + uVar30) {
                uVar30 = check_7zip_header_in_sfx(pcVar14);
                if (uVar30 == 0) {
                  pvVar21 = a->format->data;
                  __archive_read_consume(a,(long)pcVar14 - (long)pcVar26);
                  *(long *)((long)pvVar21 + 0x88) =
                       lVar38 + ((long)pcVar14 - (long)pcVar26) + 0x27000;
                  piVar13 = (int *)__archive_read_ahead(a,0x20,&offset);
                  if (piVar13 != (int *)0x0) goto LAB_00180745;
                  goto LAB_00180886;
                }
              }
              __archive_read_consume(a,(long)pcVar14 - (long)pcVar26);
              lVar38 = lVar38 + ((long)pcVar14 - (long)pcVar26);
              uVar39 = uVar20;
              if (uVar20 == 1) {
                uVar39 = 0x1000;
              }
            }
          }
          uVar39 = uVar20 >> 1;
        } while (0x7f < uVar20);
LAB_00180869:
        archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
        goto LAB_00180886;
      }
LAB_00180745:
      iVar9 = -0x1e;
      ppuVar1 = &si[1].pi.digest.digests;
      *ppuVar1 = *ppuVar1 + 8;
      iVar8 = bcmp(piVar13,anon_var_dwarf_142740,6);
      if (iVar8 != 0) {
        archive_set_error(&a->archive,-1,"Not 7-Zip archive file");
        goto LAB_00180888;
      }
      cm_zlib_crc32(0,(uchar *)(piVar13 + 3),0x14);
      uVar32 = *(uint64_t *)(piVar13 + 5);
      if (uVar32 == 0) {
        iVar9 = 1;
        goto LAB_00180888;
      }
      puVar10 = *(uint64_t **)(piVar13 + 3);
      if ((long)puVar10 < 0) {
LAB_001818dd:
        pcVar26 = "Malformed 7-Zip archive";
LAB_001818ec:
        archive_set_error(&a->archive,-1,pcVar26);
LAB_001818f7:
        bVar40 = false;
        iVar9 = -0x1e;
      }
      else {
        local_b0 = (uint64_t *)(ulong)(uint)piVar13[7];
        __archive_read_consume(a,0x20);
        if (puVar10 != (uint64_t *)0x0) {
          if ((long)puVar10 <= offset) {
            __archive_read_consume(a,(int64_t)puVar10);
            goto LAB_00180d9e;
          }
          iVar15 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar10,0);
          if (-1 < iVar15) goto LAB_00180d9e;
          goto LAB_001818f7;
        }
LAB_00180d9e:
        si[2].pi.positions = puVar10;
        si[1].pi.digest.defineds = (uchar *)puVar10;
        si[1].pi.numPackStreams = uVar32;
        si[1].pi.sizes = (uint64_t *)0x0;
        si[1].pi.pos = 1;
        *(undefined4 *)&si[199].ci.folders = 0;
        puVar16 = header_bytes(a,1);
        if (puVar16 == (uchar *)0x0) {
          pcVar26 = "Truncated 7-Zip file body";
          iVar9 = 0x54;
LAB_00180e12:
          archive_set_error(&a->archive,iVar9,pcVar26);
          goto LAB_001818f7;
        }
        if (*puVar16 == '\x17') {
          pvVar21 = a->format->data;
          piVar13 = __errno_location();
          *piVar13 = 0;
          iVar9 = read_StreamsInfo(a,si);
          if (iVar9 < 0) {
            pcVar26 = "Malformed 7-Zip archive";
            if (*piVar13 == 0xc) {
              pcVar26 = "Couldn\'t allocate memory";
            }
LAB_00180f04:
            archive_set_error(&a->archive,-1,pcVar26);
            iVar9 = -0x1e;
LAB_00180f17:
            bVar40 = true;
          }
          else {
            pcVar26 = "Malformed 7-Zip archive";
            if (((si->pi).numPackStreams == 0) || ((si->ci).numFolders == 0)) goto LAB_00180f04;
            uVar32 = (si->pi).pos;
            pcVar26 = "Malformed Header offset";
            if ((((long)uVar32 < 0) ||
                ((uVar4 = *(si->pi).sizes, uVar4 == 0 ||
                 (uVar39 = uVar4 + uVar32, *(ulong *)((long)pvVar21 + 0x80) < uVar39)))) ||
               ((long)uVar39 < 0)) goto LAB_00180f04;
            if (si[1].pi.sizes != local_b0) {
              iVar9 = -1;
              archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
              goto LAB_00180f17;
            }
            p_Var36 = (si->ci).folders;
            bVar40 = p_Var36->digest_defined != '\0';
            if (bVar40) {
              local_b0 = (uint64_t *)(ulong)p_Var36->digest;
            }
            if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
              read_consume(a);
              p_Var36 = (si->ci).folders;
            }
            iVar9 = setup_decode_folder(a,p_Var36,1);
            if (iVar9 == 0) {
              si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
              iVar9 = seek_pack(a);
            }
          }
          free_StreamsInfo(si);
          (si->ss).unpackSizes = (uint64_t *)0x0;
          (si->ss).digestsDefined = (uchar *)0x0;
          (si->ci).dataStreamIndex = 0;
          (si->ss).unpack_streams = 0;
          (si->ci).numFolders = 0;
          (si->ci).folders = (_7z_folder *)0x0;
          (si->pi).digest.digests = (uint32_t *)0x0;
          (si->pi).positions = (uint64_t *)0x0;
          (si->pi).sizes = (uint64_t *)0x0;
          (si->pi).digest.defineds = (uchar *)0x0;
          (si->pi).pos = 0;
          (si->pi).numPackStreams = 0;
          (si->ss).digests = (uint32_t *)0x0;
          if (iVar9 < 0) goto LAB_001818f7;
          *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
          si[1].pi.sizes = (uint64_t *)0x0;
          local_74 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),!bVar40);
        }
        else {
          if (*puVar16 != '\x01') {
            archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
            goto LAB_001818f7;
          }
          local_74 = 0;
          piVar13 = __errno_location();
        }
        *piVar13 = 0;
        si_00 = (_7z_stream_info *)a->format->data;
        if (((*(int *)((long)&si[1].pi.pos + 4) != 0) &&
            ((puVar16 = header_bytes(a,1), puVar16 == (uchar *)0x0 || (*puVar16 != '\x01')))) ||
           (puVar16 = header_bytes(a,1), puVar16 == (uchar *)0x0)) {
LAB_00181684:
          if (*piVar13 == 0xc) {
            pcVar26 = "Couldn\'t allocate memory";
          }
          else {
            pcVar26 = "Damaged 7-Zip archive";
          }
          goto LAB_001818ec;
        }
        uVar6 = *puVar16;
        if (uVar6 == '\x02') {
          do {
            puVar16 = header_bytes(a,1);
            if (puVar16 == (uchar *)0x0) break;
            if (*puVar16 == '\0') {
              puVar16 = header_bytes(a,1);
              if (puVar16 != (uchar *)0x0) {
                uVar6 = *puVar16;
                goto LAB_00181028;
              }
              break;
            }
            iVar9 = parse_7zip_uint64(a,&size);
          } while (-1 < iVar9);
          goto LAB_00181684;
        }
LAB_00181028:
        if (uVar6 == '\x04') {
          iVar9 = read_StreamsInfo(a,si_00);
          if ((iVar9 < 0) || (puVar16 = header_bytes(a,1), puVar16 == (uchar *)0x0))
          goto LAB_00181684;
          uVar6 = *puVar16;
        }
        if (uVar6 != '\0') {
          if (uVar6 == '\x05') {
            val = &si_00[1].ci;
            iVar9 = parse_7zip_uint64(a,&val->numFolders);
            if ((-1 < iVar9) && (val->numFolders < 0x5f5e101)) {
              local_80 = (_7z_folder *)calloc(val->numFolders,0x58);
              si_00[1].ci.folders = local_80;
              if (local_80 != (_7z_folder *)0x0) {
                local_88 = (uchar *)0x0;
LAB_001810d2:
                do {
                  pbVar17 = header_bytes(a,1);
                  if (pbVar17 == (byte *)0x0) break;
                  bVar3 = *pbVar17;
                  if (bVar3 == 0) {
                    p_Var36 = (si_00->ci).folders;
                    local_88 = header.emptyFileBools;
                    uVar30 = 0;
                    uVar35 = 0;
                    uVar34 = 0;
                    iVar8 = 0;
                    iVar9 = 0;
                    goto LAB_001816d7;
                  }
                  iVar9 = parse_7zip_uint64(a,&size);
                  uVar32 = size;
                  if ((iVar9 < 0) || (si_00[1].pi.numPackStreams < size)) break;
                  if (bVar3 - 0xe < 0xc) {
                    uVar39 = (ulong)local_88 & 0xffffffff;
                    switch((uint)bVar3) {
                    case 0xe:
                      if (header.emptyStreamBools != (uchar *)0x0) goto LAB_00181684;
                      sVar5 = val->numFolders;
                      puVar16 = (uchar *)calloc(sVar5,1);
                      header.emptyStreamBools = puVar16;
                      if ((puVar16 == (uchar *)0x0) ||
                         (iVar9 = read_Bools(a,puVar16,sVar5), iVar9 < 0)) goto LAB_00181684;
                      local_88 = (uchar *)0x0;
                      for (uVar30 = 0; (ulong)uVar30 < val->numFolders; uVar30 = uVar30 + 1) {
                        local_88 = (uchar *)(ulong)(((int)local_88 + 1) -
                                                   (uint)(puVar16[uVar30] == '\0'));
                      }
                      goto LAB_001810d2;
                    case 0xf:
                      if (0 < (int)local_88) {
                        if (header.emptyFileBools != (uchar *)0x0) goto LAB_00181684;
                        puVar16 = (uchar *)calloc(uVar39,1);
                        header.emptyFileBools = puVar16;
LAB_001813e1:
                        if ((puVar16 == (uchar *)0x0) ||
                           (iVar9 = read_Bools(a,puVar16,uVar39), iVar9 < 0)) goto LAB_00181684;
                        goto LAB_001810d2;
                      }
                      break;
                    case 0x10:
                      if (0 < (int)local_88) {
                        if (header.antiBools == (uchar *)0x0) {
                          puVar16 = (uchar *)calloc(uVar39,1);
                          header.antiBools = puVar16;
                          goto LAB_001813e1;
                        }
                        goto LAB_00181684;
                      }
                      break;
                    case 0x11:
                      puVar16 = header_bytes(a,1);
                      if ((((puVar16 == (uchar *)0x0) || (uVar39 = uVar32 - 1, (uVar39 & 1) != 0))
                          || (uVar39 < val->numFolders << 2)) || (si_00[1].ss.unpack_streams != 0))
                      goto LAB_00181684;
                      pvVar21 = malloc(uVar39);
                      si_00[1].ss.unpack_streams = (size_t)pvVar21;
                      uVar20 = uVar39;
                      if (pvVar21 == (void *)0x0) goto LAB_00181684;
                      for (; uVar20 != 0; uVar20 = uVar20 - rbytes) {
                        rbytes = 0x10000;
                        if (uVar20 < 0x10000) {
                          rbytes = uVar20;
                        }
                        puVar16 = header_bytes(a,rbytes);
                        if (puVar16 == (uchar *)0x0) goto LAB_00181684;
                        memcpy(pvVar21,puVar16,rbytes);
                        pvVar21 = (void *)((long)pvVar21 + rbytes);
                      }
                      uVar20 = si_00[1].ci.numFolders;
                      p_Var24 = (_7z_coder *)si_00[1].ss.unpack_streams;
                      for (uVar30 = 0; uVar19 = (ulong)uVar30, uVar19 < uVar20; uVar30 = uVar30 + 1)
                      {
                        (&local_80->coders)[uVar19 * 0xb] = p_Var24;
                        uVar32 = 0;
                        uVar33 = uVar39;
                        p_Var25 = p_Var24;
                        while( true ) {
                          p_Var24 = (_7z_coder *)((long)&p_Var25->codec + 2);
                          if (uVar33 < 2) goto LAB_00181684;
                          if (((char)p_Var25->codec == '\0') &&
                             (*(undefined1 *)((long)&p_Var25->codec + 1) == '\0')) break;
                          uVar33 = uVar33 - 2;
                          uVar32 = uVar32 + 2;
                          p_Var25 = p_Var24;
                        }
                        (&local_80->numCoders)[uVar19 * 0xb] = uVar32;
                        uVar39 = (uVar39 - uVar32) - 2;
                      }
                      goto LAB_001810d2;
                    default:
                      pvVar21 = a->format->data;
                      lVar38 = *(long *)((long)pvVar21 + 0xa0);
                      puVar16 = (uchar *)calloc(*(size_t *)((long)pvVar21 + 0x98),1);
                      if (puVar16 == (uchar *)0x0) goto LAB_00181684;
                      puVar22 = header_bytes(a,1);
                      if (puVar22 != (uchar *)0x0) {
                        if (*puVar22 == '\0') {
                          iVar9 = read_Bools(a,puVar16,*(size_t *)((long)pvVar21 + 0x98));
                          if (iVar9 < 0) goto LAB_00181677;
                        }
                        else {
                          memset(puVar16,1,*(size_t *)((long)pvVar21 + 0x98));
                        }
                        puVar22 = header_bytes(a,1);
                        if ((puVar22 != (uchar *)0x0) &&
                           ((*puVar22 == '\0' ||
                            ((iVar9 = parse_7zip_uint64(a,&header.dataIndex), -1 < iVar9 &&
                             (header.dataIndex < 0x5f5e101)))))) {
                          for (uVar30 = 0; uVar39 = (ulong)uVar30,
                              uVar39 < *(ulong *)((long)pvVar21 + 0x98); uVar30 = uVar30 + 1) {
                            if (puVar16[uVar39] != '\0') {
                              puVar18 = (ulong *)header_bytes(a,8);
                              if (puVar18 == (ulong *)0x0) goto LAB_00181677;
                              if (bVar3 == 0x14) {
                                if (*puVar18 < 0x19db1ded53e8000) {
                                  uVar20 = 0;
                                  lVar23 = 0;
                                }
                                else {
                                  uVar19 = *puVar18 + 0xfe624e212ac18000;
                                  uVar20 = uVar19 / 10000000;
                                  lVar23 = (uVar19 % 10000000) * 100;
                                }
                                lVar27 = uVar39 * 0x58 + lVar38;
                                *(ulong *)(lVar27 + 0x20) = uVar20;
                                *(long *)(lVar27 + 0x38) = lVar23;
                                uVar34 = 1;
                              }
                              else if (bVar3 == 0x13) {
                                if (*puVar18 < 0x19db1ded53e8000) {
                                  uVar20 = 0;
                                  lVar23 = 0;
                                }
                                else {
                                  uVar19 = *puVar18 + 0xfe624e212ac18000;
                                  uVar20 = uVar19 / 10000000;
                                  lVar23 = (uVar19 % 10000000) * 100;
                                }
                                lVar27 = uVar39 * 0x58 + lVar38;
                                *(ulong *)(lVar27 + 0x28) = uVar20;
                                *(long *)(lVar27 + 0x40) = lVar23;
                                uVar34 = 2;
                              }
                              else {
                                if (bVar3 != 0x12) goto LAB_00181315;
                                if (*puVar18 < 0x19db1ded53e8000) {
                                  uVar20 = 0;
                                  lVar23 = 0;
                                }
                                else {
                                  uVar19 = *puVar18 + 0xfe624e212ac18000;
                                  uVar20 = uVar19 / 10000000;
                                  lVar23 = (uVar19 % 10000000) * 100;
                                }
                                lVar27 = uVar39 * 0x58 + lVar38;
                                *(ulong *)(lVar27 + 0x30) = uVar20;
                                *(long *)(lVar27 + 0x48) = lVar23;
                                uVar34 = 4;
                              }
                              puVar2 = (uint *)(lVar38 + 0x18 + uVar39 * 0x58);
                              *puVar2 = *puVar2 | uVar34;
                            }
LAB_00181315:
                          }
                          free(puVar16);
                          goto LAB_001810d2;
                        }
                      }
LAB_00181677:
                      free(puVar16);
                      goto LAB_00181684;
                    case 0x15:
                      puVar16 = header_bytes(a,2);
                      if ((puVar16 == (uchar *)0x0) || (header.attrBools != (uchar *)0x0))
                      goto LAB_00181684;
                      uVar6 = *puVar16;
                      sVar5 = val->numFolders;
                      puVar16 = (uchar *)calloc(sVar5,1);
                      header.attrBools = puVar16;
                      if (puVar16 == (uchar *)0x0) goto LAB_00181684;
                      if (uVar6 == '\0') {
                        iVar9 = read_Bools(a,puVar16,sVar5);
                        if (iVar9 < 0) goto LAB_00181684;
                      }
                      else {
                        memset(puVar16,1,sVar5);
                      }
                      for (uVar30 = 0; uVar39 = (ulong)uVar30, uVar39 < val->numFolders;
                          uVar30 = uVar30 + 1) {
                        if (puVar16[uVar39] != '\0') {
                          puVar22 = header_bytes(a,4);
                          if (puVar22 == (uchar *)0x0) goto LAB_00181684;
                          *(undefined4 *)((long)&local_80->numUnpackStreams + uVar39 * 0x58 + 4) =
                               *(undefined4 *)puVar22;
                        }
                      }
                      goto LAB_001810d2;
                    case 0x16:
                    case 0x17:
                    case 0x18:
                      break;
                    case 0x19:
                      if (size == 0) goto LAB_001810d2;
                    }
                  }
                  puVar16 = header_bytes(a,size);
                } while (puVar16 != (uchar *)0x0);
              }
            }
          }
          goto LAB_00181684;
        }
LAB_001818c5:
        puVar16 = header_bytes(a,1);
        if ((puVar16 == (uchar *)0x0) || (*puVar16 != '\0')) goto LAB_001818dd;
        if (((char)local_74 == '\0') && (si[1].pi.sizes != local_b0)) {
          pcVar26 = "Malformed 7-Zip archive";
          iVar9 = -1;
          goto LAB_00180e12;
        }
        si[2].pi.digest.digests = (uint32_t *)0x0;
        si[2].ss.unpackSizes = (uint64_t *)0x0;
        *(undefined4 *)&si[1].pi.pos = 0;
        si[2].ci.folders = (_7z_folder *)0x0;
        si[2].ci.dataStreamIndex = 0;
        iVar9 = 0;
        bVar40 = true;
      }
    }
    free(header.emptyStreamBools);
    free(header.emptyFileBools);
    free(header.antiBools);
    free(header.attrBools);
    if (!bVar40) {
      return iVar9;
    }
    puVar10 = (uint64_t *)si[1].ci.numFolders;
    p_Var36 = si[1].ci.folders;
    si[1].pi.positions = puVar10;
  }
  else {
    puVar10 = si[1].pi.positions;
    p_Var36 = (_7z_folder *)(si[1].ci.dataStreamIndex + 0x58);
  }
  si[1].ci.dataStreamIndex = (uint64_t)p_Var36;
  if (p_Var36 == (_7z_folder *)0x0 || puVar10 == (uint64_t *)0x0) {
    return 1;
  }
  si[1].pi.positions = (uint64_t *)((long)puVar10 + -1);
  si[1].ss.unpackSizes = (uint64_t *)0x0;
  *(undefined1 *)&si[2].pi.pos = 0;
  puVar11 = (uint32_t *)cm_zlib_crc32(0,(uchar *)0x0,0);
  si[1].ss.digests = puVar11;
  if (si[0xc6].ss.digestsDefined == (uchar *)0x0) {
    paVar12 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
    si[0xc6].ss.digestsDefined = (uchar *)paVar12;
    if (paVar12 != (archive_string_conv *)0x0) goto LAB_00180951;
LAB_00180cb7:
    iVar9 = -0x1e;
  }
  else {
LAB_00180951:
    uVar39 = (ulong)(uint)p_Var36->numBindPairs;
    if ((uVar39 < (si->ci).numFolders) && (p_Var28 = (si->ci).folders, p_Var28 != (_7z_folder *)0x0)
       ) {
      p_Var28 = p_Var28 + uVar39;
      lVar38 = 0;
      for (uVar39 = 0; uVar39 < p_Var28->numCoders; uVar39 = uVar39 + 1) {
        lVar23 = *(long *)((long)&p_Var28->coders->codec + lVar38);
        if (((lVar23 == 0x6f10101) || (lVar23 == 0x6f10701)) || (lVar23 == 0x6f10303)) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          *(undefined4 *)&si[199].ci.folders = 1;
        }
        lVar38 = lVar38 + 0x28;
      }
    }
    if (*(int *)&si[199].ci.folders == -1) {
      *(undefined4 *)&si[199].ci.folders = 0;
    }
    wVar7 = _archive_entry_copy_pathname_l
                      (entry,(char *)p_Var36->coders,p_Var36->numCoders,
                       (archive_string_conv *)si[0xc6].ss.digestsDefined);
    if (wVar7 == L'\0') {
      iVar9 = 0;
    }
    else {
      piVar13 = __errno_location();
      if (*piVar13 == 0xc) {
        pcVar26 = "Can\'t allocate memory for Pathname";
LAB_00180cb0:
        archive_set_error(&a->archive,0xc,pcVar26);
        goto LAB_00180cb7;
      }
      pcVar26 = archive_string_conversion_charset_name
                          ((archive_string_conv *)si[0xc6].ss.digestsDefined);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar26);
      iVar9 = -0x14;
    }
    archive_entry_set_mode(entry,(mode_t)p_Var36->numUnpackStreams);
    uVar30 = *(uint *)&p_Var36->bindPairs;
    if ((uVar30 & 1) != 0) {
      archive_entry_set_mtime(entry,p_Var36->numPackedStreams,p_Var36->numOutStreams);
      uVar30 = *(uint *)&p_Var36->bindPairs;
    }
    if ((uVar30 & 4) != 0) {
      lVar38._0_1_ = p_Var36->digest_defined;
      lVar38._1_3_ = *(undefined3 *)&p_Var36->field_0x49;
      lVar38._4_4_ = p_Var36->digest;
      archive_entry_set_ctime(entry,p_Var36->numInStreams,lVar38);
      uVar30 = *(uint *)&p_Var36->bindPairs;
    }
    if ((uVar30 & 2) != 0) {
      archive_entry_set_atime(entry,(time_t)p_Var36->packedStreams,(long)p_Var36->unPackSize);
    }
    uVar39 = (ulong)*(uint *)((long)&p_Var36->numBindPairs + 4);
    if (uVar39 == 0xffffffff) {
      puVar16 = (uchar *)0x0;
    }
    else {
      puVar16 = (uchar *)(si->ss).unpackSizes[uVar39];
    }
    si[1].ss.digestsDefined = puVar16;
    archive_entry_set_size(entry,(la_int64_t)puVar16);
    uVar32 = p_Var36->numUnpackStreams;
    if (((uVar32 & 0x700000000) != 0) && (pcVar26 = (char *)malloc(0x16), pcVar26 != (char *)0x0)) {
      pcVar14 = pcVar26;
      if ((uVar32 & 0x100000000) != 0) {
        builtin_strncpy(pcVar26,"rdonly,",8);
        pcVar14 = pcVar26 + 7;
      }
      if ((uVar32 & 0x200000000) != 0) {
        builtin_strncpy(pcVar14,"hidden,",8);
        pcVar14 = pcVar14 + 7;
      }
      if ((uVar32 & 0x400000000) != 0) {
        builtin_strncpy(pcVar14,"system,",8);
        pcVar14 = pcVar14 + 7;
      }
      if (pcVar26 < pcVar14) {
        pcVar14[-1] = '\0';
        archive_entry_copy_fflags_text(entry,pcVar26);
      }
      free(pcVar26);
    }
    puVar16 = si[1].ss.digestsDefined;
    if (puVar16 == (uchar *)0x0) {
      *(undefined1 *)&si[2].pi.pos = 1;
    }
    if ((p_Var36->numUnpackStreams & 0xf000) == 0xa000) {
      lVar38 = 0;
      pcVar26 = (char *)0x0;
      while (puVar16 != (uchar *)0x0) {
        iVar8 = archive_read_format_7zip_read_data(a,(void **)&header,&size,&offset);
        uVar32 = size;
        if (iVar8 < -0x14) {
          free(pcVar26);
          return iVar8;
        }
        pcVar14 = (char *)realloc(pcVar26,size + lVar38 + 1);
        if (pcVar14 == (char *)0x0) {
          free(pcVar26);
          pcVar26 = "Can\'t allocate memory for Symname";
          goto LAB_00180cb0;
        }
        memcpy(pcVar14 + lVar38,(void *)header.dataIndex,uVar32);
        lVar38 = lVar38 + uVar32;
        pcVar26 = pcVar14;
        puVar16 = si[1].ss.digestsDefined;
      }
      if (lVar38 == 0) {
        uVar30 = (uint)p_Var36->numUnpackStreams & 0xffff0fff | 0x8000;
        *(uint *)&p_Var36->numUnpackStreams = uVar30;
        archive_entry_set_mode(entry,uVar30);
      }
      else {
        pcVar26[lVar38] = '\0';
        archive_entry_copy_symlink(entry,pcVar26);
      }
      free(pcVar26);
      archive_entry_set_size(entry,0);
    }
    *(undefined2 *)((long)&si[0xc6].ss.digests + 4) = 0x70;
    *(undefined4 *)&si[0xc6].ss.digests = 0x695a2d37;
    (a->archive).archive_format_name = (char *)&si[0xc6].ss.digests;
  }
  return iVar9;
LAB_001816d7:
  uVar39 = (ulong)uVar34;
  if (val->numFolders <= uVar39) goto LAB_001818c5;
  if ((header.emptyStreamBools == (uchar *)0x0) || (header.emptyStreamBools[uVar39] == '\0')) {
    *(byte *)(&local_80->bindPairs + uVar39 * 0xb) =
         *(byte *)(&local_80->bindPairs + uVar39 * 0xb) | 0x10;
  }
  uVar31 = *(uint *)((long)&local_80->numUnpackStreams + uVar39 * 0x58 + 4);
  if ((short)uVar31 < 0) {
    uVar29 = uVar31 >> 0x10;
  }
  else {
    uVar29 = 0x416d;
    if ((uVar31 & 0x10) == 0) {
      uVar29 = 0x8124;
    }
    uVar29 = uVar29 | (uint)((uVar31 & 1) == 0) << 7;
  }
  puVar10 = &local_80->numCoders + uVar39 * 0xb;
  *(uint *)(puVar10 + 10) = uVar29;
  if ((*(uint *)(puVar10 + 3) & 0x10) == 0) {
    if (header.emptyFileBools == (uchar *)0x0) {
      if (uVar29 != 0) {
        bVar40 = false;
        goto LAB_001817d1;
      }
LAB_001817fe:
      uVar29 = 0x41ff;
LAB_00181803:
      *(uint *)(puVar10 + 10) = uVar29;
LAB_00181807:
      uVar39 = *puVar10;
      if ((1 < uVar39) &&
         ((p_Var24 = (_7z_coder *)puVar10[1], *(char *)((long)p_Var24 + (uVar39 - 2)) != '/' ||
          (*(char *)((long)p_Var24 + (uVar39 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var24->codec + uVar39) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar10[1])->codec + *puVar10 + 1) = 0;
        *puVar10 = *puVar10 + 2;
        uVar31 = *(uint *)((long)puVar10 + 0x54);
      }
    }
    else {
      lVar38 = (long)iVar8;
      bVar40 = header.emptyFileBools[lVar38] != '\0';
      iVar8 = iVar8 + 1;
      if (uVar29 != 0) {
LAB_001817d1:
        if (((uVar29 & 0xf000) != 0x4000) && (!bVar40)) {
          uVar29 = uVar29 & 0xfff | 0x4000;
          goto LAB_00181803;
        }
        if ((uVar29 & 0xf000) != 0x4000) goto LAB_0018183a;
        goto LAB_00181807;
      }
      if (header.emptyFileBools[lVar38] == '\0') goto LAB_001817fe;
      *(undefined4 *)(puVar10 + 10) = 0x81b6;
    }
LAB_0018183a:
    *(undefined4 *)((long)puVar10 + 0x14) = 0xffffffff;
  }
  else {
    if ((si_00->ss).unpack_streams <= (ulong)(long)iVar9) goto LAB_00181684;
    if (uVar29 == 0) {
      *(undefined4 *)(puVar10 + 10) = 0x81b6;
    }
    if ((si_00->ss).digestsDefined[iVar9] != '\0') {
      *(uint *)(puVar10 + 3) = *(uint *)(puVar10 + 3) | 8;
    }
    *(int *)((long)puVar10 + 0x14) = iVar9;
    iVar9 = iVar9 + 1;
  }
  if ((uVar31 & 1) != 0) {
    *(byte *)(puVar10 + 10) = (byte)puVar10[10] & 0x6d;
  }
  if (((ulong)puVar10[3] & 0x10) == 0 && uVar35 == 0) {
    *(undefined4 *)(puVar10 + 2) = 0xffffffff;
    uVar35 = 0;
  }
  else {
    if (uVar35 == 0) {
      while( true ) {
        if ((si_00->ci).numFolders <= (ulong)uVar30) goto LAB_00181684;
        if (p_Var36[uVar30].numUnpackStreams != 0) break;
        uVar30 = uVar30 + 1;
      }
    }
    *(uint *)(puVar10 + 2) = uVar30;
    if (((ulong)puVar10[3] & 0x10) != 0) {
      uVar35 = uVar35 + 1;
      uVar20 = (ulong)uVar35;
      uVar39 = p_Var36[uVar30].numUnpackStreams;
      if (uVar39 <= uVar20) {
        uVar35 = 0;
      }
      uVar30 = uVar30 + (uVar39 <= uVar20);
    }
  }
  uVar34 = uVar34 + 1;
  goto LAB_001816d7;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0 || zip_entry == NULL)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	// These attributes are supported by the windows implementation of archive_write_disk.
	const int supported_attrs = FILE_ATTRIBUTE_READONLY | FILE_ATTRIBUTE_HIDDEN | FILE_ATTRIBUTE_SYSTEM;

	if (zip_entry->attr & supported_attrs) {
		char *fflags_text, *ptr;
		/* allocate for "rdonly,hidden,system," */
		fflags_text = malloc(22 * sizeof(char));
		if (fflags_text != NULL) {
			ptr = fflags_text; 
			if (zip_entry->attr & FILE_ATTRIBUTE_READONLY) { 
 			strcpy(ptr, "rdonly,"); 
 			ptr = ptr + 7; 
 		} 
 		if (zip_entry->attr & FILE_ATTRIBUTE_HIDDEN) { 
 			strcpy(ptr, "hidden,"); 
 			ptr = ptr + 7; 
 		} 
 		if (zip_entry->attr & FILE_ATTRIBUTE_SYSTEM) { 
 			strcpy(ptr, "system,"); 
 			ptr = ptr + 7; 
 		} 
 		if (ptr > fflags_text) { 
 			/* Delete trailing comma */ 
 			*(ptr - 1) = '\0'; 
 			archive_entry_copy_fflags_text(entry, 
				fflags_text); 
 		} 
 		free(fflags_text); 
		}
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			#ifdef __clang_analyzer__
			assert(buff);
			#endif
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no symname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			symname[symsize] = '\0';
			archive_entry_copy_symlink(entry,
			    (const char *)symname);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	snprintf(zip->format_name, sizeof(zip->format_name), "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}